

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O0

int fQS(int Ns,sunrealtype t,N_Vector y,N_Vector *yS,N_Vector yQdot,N_Vector *yQSdot,void *user_data
       ,N_Vector tmp,N_Vector tmpQ)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sunrealtype s3;
  sunrealtype s2;
  sunrealtype s1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  void *user_data_local;
  N_Vector *yQSdot_local;
  N_Vector yQdot_local;
  N_Vector *yS_local;
  N_Vector y_local;
  sunrealtype t_local;
  int Ns_local;
  
  dVar1 = **(double **)((long)y->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  **(double **)((long)(*yQSdot)->content + 0x10) =
       dVar3 * *(double *)(*(long *)((long)(*yS)->content + 0x10) + 0x10) +
       dVar1 * **(double **)((long)(*yS)->content + 0x10) +
       dVar2 * *(double *)(*(long *)((long)(*yS)->content + 0x10) + 8);
  **(double **)((long)yQSdot[1]->content + 0x10) =
       dVar3 * *(double *)(*(long *)((long)yS[1]->content + 0x10) + 0x10) +
       dVar1 * **(double **)((long)yS[1]->content + 0x10) +
       dVar2 * *(double *)(*(long *)((long)yS[1]->content + 0x10) + 8);
  return 0;
}

Assistant:

static int fQS(int Ns, sunrealtype t, N_Vector y, N_Vector* yS, N_Vector yQdot,
               N_Vector* yQSdot, void* user_data, N_Vector tmp, N_Vector tmpQ)
{
  sunrealtype y1, y2, y3;
  sunrealtype s1, s2, s3;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  /* 1st sensitivity RHS */

  s1 = Ith(yS[0], 1);
  s2 = Ith(yS[0], 2);
  s3 = Ith(yS[0], 3);

  Ith(yQSdot[0], 1) = y1 * s1 + y2 * s2 + y3 * s3;

  /* 1st sensitivity RHS */

  s1 = Ith(yS[1], 1);
  s2 = Ith(yS[1], 2);
  s3 = Ith(yS[1], 3);

  Ith(yQSdot[1], 1) = y1 * s1 + y2 * s2 + y3 * s3;

  return (0);
}